

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

u8 __thiscall moira::Moira::readFC(Moira *this)

{
  u8 uVar1;
  
  uVar1 = this->fcSource;
  if (uVar1 == '\x02') {
    return (u8)(this->reg).dfc;
  }
  if (uVar1 != '\x01') {
    if (uVar1 == '\0') {
      return (this->reg).sr.s << 2 | this->fcl;
    }
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                  ,0x326,"u8 moira::Moira::readFC() const");
  }
  return (u8)(this->reg).sfc;
}

Assistant:

u8
Moira::readFC() const
{
    switch (fcSource) {

        case 0: return u8((reg.sr.s ? 4 : 0) | fcl);
        case 1: return u8(reg.sfc);
        case 2: return u8(reg.dfc);

        default:
            fatalError;
    }
}